

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

bool __thiscall
DNSResolve::ParseResponse
          (DNSResolve *this,char *recv_data,string *hostname,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ip_result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cname_result)

{
  undefined8 this_00;
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  ulong uVar4;
  size_t sVar5;
  uint16_t *puVar6;
  allocator local_161;
  value_type local_160;
  allocator local_129;
  value_type local_128;
  char local_108 [8];
  char ip_str [16];
  undefined4 local_f0;
  uint16_t local_ea;
  in_addr addr;
  uint16_t answer_data_len;
  uint32_t answer_ttl;
  uint16_t answer_class;
  uint16_t answer_type;
  int answer_index;
  int question_index;
  char *dns_data;
  uint16_t answer_count;
  uint16_t question_count;
  DNSHeader *dns_header;
  char local_b8 [6];
  uint16_t encoded_name_len;
  char dot_name [128];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cname_result_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ip_result_local;
  string *hostname_local;
  char *recv_data_local;
  DNSResolve *this_local;
  
  dot_name._120_8_ = cname_result;
  memset(local_b8,0,0x80);
  dns_header._6_2_ = 0;
  uVar2 = ntohs(*(uint16_t *)(recv_data + 2));
  if ((uVar2 & 0xfb7f) == 0x8100) {
    uVar2 = ntohs(*(uint16_t *)(recv_data + 4));
    uVar3 = ntohs(*(uint16_t *)(recv_data + 6));
    if (uVar3 != 0) {
      _answer_index = recv_data + 0xc;
      for (_answer_class = 0; _answer_class != uVar2; _answer_class = _answer_class + 1) {
        bVar1 = DecodeDotStr(this,_answer_index,(uint16_t *)((long)&dns_header + 6),local_b8,0x80,
                             (char *)0x0);
        if (!bVar1) {
          return false;
        }
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) != 0) && (sVar5 = strlen(local_b8), sVar5 != 0)) {
          std::__cxx11::string::operator=((string *)hostname,local_b8);
        }
        _answer_index =
             _answer_index +
             (int)((uint)dns_header._6_2_ + (uint)this->kDnsTypeSize + (uint)this->kDnsClassSzie);
      }
      for (answer_ttl = 0; answer_ttl != uVar3; answer_ttl = answer_ttl + 1) {
        bVar1 = DecodeDotStr(this,_answer_index,(uint16_t *)((long)&dns_header + 6),local_b8,0x80,
                             recv_data);
        if (!bVar1) {
          return false;
        }
        puVar6 = (uint16_t *)(_answer_index + (int)(uint)dns_header._6_2_);
        uVar2 = ntohs(*puVar6);
        ntohs(*(uint16_t *)((long)puVar6 + (long)(int)(uint)this->kDnsTypeSize));
        addr.s_addr = ntohl(*(uint32_t *)
                             ((long)puVar6 +
                             (long)(int)(uint)this->kDnsClassSzie +
                             (long)(int)(uint)this->kDnsTypeSize));
        local_ea = ntohs(*(uint16_t *)
                          ((long)puVar6 +
                          (long)(int)(uint)this->kDnsTtlSize +
                          (long)(int)(uint)this->kDnsClassSzie + (long)(int)(uint)this->kDnsTypeSize
                          ));
        _answer_index =
             (char *)((long)puVar6 +
                     (long)(int)((uint)this->kDnsTypeSize + (uint)this->kDnsClassSzie +
                                 (uint)this->kDnsTtlSize + (uint)this->kDnsDatalenSize));
        if (uVar2 == 1) {
          local_f0 = *(undefined4 *)_answer_index;
          inet_ntop(2,&local_f0,local_108,0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_128,local_108,&local_129);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(ip_result,&local_128);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
        }
        else if (uVar2 == this->kDnsTypeCname) {
          bVar1 = DecodeDotStr(this,_answer_index,(uint16_t *)((long)&dns_header + 6),local_b8,0x80,
                               recv_data);
          this_00 = dot_name._120_8_;
          if (!bVar1) {
            return false;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_160,local_b8,&local_161);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator((allocator<char> *)&local_161);
        }
        _answer_index = _answer_index + (int)(uint)local_ea;
      }
    }
  }
  return true;
}

Assistant:

bool DNSResolve::ParseResponse(
    char* recv_data,
    string& hostname,
    vector<string>& ip_result,
    vector<string>& cname_result)
{
    char dot_name[128] = { '\0' };
    uint16_t encoded_name_len = 0;

    DNSHeader *dns_header = (DNSHeader*)recv_data;
    uint16_t question_count = 0;
    uint16_t answer_count = 0;

    if ((ntohs(dns_header->flags) & 0xfb7f) == 0x8100 //RFC1035 4.1.1(Header section format)
            && (question_count = ntohs(dns_header->question_count)) >= 0
            && (answer_count = ntohs(dns_header->answer_count)) > 0)
    {
        char *dns_data = recv_data + sizeof(DNSHeader);

        //resolve Question fields
        for (int question_index = 0; question_index != question_count; ++question_index)
        {
            if (!DecodeDotStr(dns_data, &encoded_name_len, dot_name, sizeof(dot_name)))
            {
                return false;
            }
            if (hostname.empty() && strlen(dot_name) > 0)
            {
                hostname = dot_name;
            }
            dns_data += (encoded_name_len + kDnsTypeSize + kDnsClassSzie);
        }

        //resolve Answer fields
        for (int answer_index = 0; answer_index != answer_count; ++answer_index)
        {
            if (!DecodeDotStr(dns_data, &encoded_name_len, dot_name, sizeof(dot_name), recv_data))
            {
                return false;
            }
            dns_data += encoded_name_len;

            uint16_t answer_type = ntohs(*(uint16_t*)(dns_data));
            uint16_t answer_class = ntohs(*(uint16_t*)(dns_data + kDnsTypeSize));
            uint32_t answer_ttl = ntohl(*(uint32_t*)(dns_data + kDnsTypeSize + kDnsClassSzie));
            uint16_t answer_data_len = ntohs(*(uint16_t*)(dns_data + kDnsTypeSize + kDnsClassSzie + kDnsTtlSize));
            dns_data += (kDnsTypeSize + kDnsClassSzie + kDnsTtlSize + kDnsDatalenSize);

            if (answer_type == kDnsTypeA)
            {
                in_addr addr;
                addr.s_addr = *(u_long*)dns_data;
                char ip_str[16];
                inet_ntop(AF_INET, &addr, ip_str, 16);
                ip_result.push_back(ip_str);
            }
            else if (answer_type == kDnsTypeCname)
            {
                if (!DecodeDotStr(dns_data, &encoded_name_len, dot_name, sizeof(dot_name), recv_data))
                {
                    return false;
                }
                cname_result.push_back(dot_name);
            }
            dns_data += (answer_data_len);
        }
    }
    return true;
}